

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxpool.h
# Opt level: O0

void __thiscall cxxpool::thread_pool::worker(thread_pool *this)

{
  bool bVar1;
  const_reference pvVar2;
  undefined1 local_60 [8];
  unique_lock<std::mutex> task_lock;
  priority_task task;
  thread_pool *this_local;
  
  do {
    detail::priority_task::priority_task((priority_task *)&task_lock._M_owns);
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)local_60,&this->task_mutex_);
    std::condition_variable::wait<cxxpool::thread_pool::worker()::_lambda()_1_>
              (&this->task_cond_var_,(unique_lock<std::mutex> *)local_60,
               (anon_class_8_1_8991fb9c)this);
    if (((this->done_ & 1U) == 0) ||
       (bVar1 = std::
                priority_queue<cxxpool::detail::priority_task,_std::vector<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>,_std::less<cxxpool::detail::priority_task>_>
                ::empty(&this->tasks_), !bVar1)) {
      pvVar2 = std::
               priority_queue<cxxpool::detail::priority_task,_std::vector<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>,_std::less<cxxpool::detail::priority_task>_>
               ::top(&this->tasks_);
      detail::priority_task::operator=((priority_task *)&task_lock._M_owns,pvVar2);
      std::
      priority_queue<cxxpool::detail::priority_task,_std::vector<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>,_std::less<cxxpool::detail::priority_task>_>
      ::pop(&this->tasks_);
      bVar1 = false;
    }
    else {
      bVar1 = true;
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_60);
    if (!bVar1) {
      detail::priority_task::operator()((priority_task *)&task_lock._M_owns);
      bVar1 = false;
    }
    detail::priority_task::~priority_task((priority_task *)&task_lock._M_owns);
  } while (!bVar1);
  return;
}

Assistant:

void worker() {
        for (;;) {
            cxxpool::detail::priority_task task;
            {
                std::unique_lock<std::mutex> task_lock(task_mutex_);
                task_cond_var_.wait(task_lock, [this]{
                    return !paused_ && (done_ || !tasks_.empty());
                });
                if (done_ && tasks_.empty())
                    break;
                task = tasks_.top();
                tasks_.pop();
            }
            task();
        }
    }